

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstSampler.h
# Opt level: O2

void __thiscall jaegertracing::samplers::ConstSampler::ConstSampler(ConstSampler *this,bool sample)

{
  long lVar1;
  initializer_list<jaegertracing::Tag> __l;
  allocator_type local_fb;
  allocator local_fa;
  allocator local_f9;
  string local_f8;
  string local_d8;
  Tag local_b8 [2];
  
  (this->super_Sampler)._vptr_Sampler = (_func_int **)&PTR__ConstSampler_00221cb8;
  this->_decision = sample;
  std::__cxx11::string::string((string *)&local_d8,"sampler.type",&local_f9);
  Tag::Tag<char_const*const&>(local_b8,&local_d8,(char **)&kSamplerTypeConst);
  std::__cxx11::string::string((string *)&local_f8,"sampler.param",&local_fa);
  Tag::Tag<bool&>(local_b8 + 1,&local_f8,&this->_decision);
  __l._M_len = 2;
  __l._M_array = local_b8;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
            (&this->_tags,__l,&local_fb);
  lVar1 = 0x48;
  do {
    Tag::~Tag((Tag *)((long)&local_b8[0]._key._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x48;
  } while (lVar1 != -0x48);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  return;
}

Assistant:

explicit ConstSampler(bool sample)
        : _decision(sample)
        , _tags({ { kSamplerTypeTagKey, kSamplerTypeConst },
                  { kSamplerParamTagKey, _decision } })
    {
    }